

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O0

bool __thiscall ON_MeshFace::IsValid(ON_MeshFace *this,uint mesh_vertex_count)

{
  bool local_23;
  bool local_22;
  bool local_21;
  uint *uvi;
  uint mesh_vertex_count_local;
  ON_MeshFace *this_local;
  
  local_21 = false;
  if (((((uint)this->vi[0] < mesh_vertex_count) &&
       (local_21 = false, (uint)this->vi[1] < mesh_vertex_count)) &&
      (local_21 = false, (uint)this->vi[2] < mesh_vertex_count)) &&
     (((local_21 = false, (uint)this->vi[3] < mesh_vertex_count &&
       (local_21 = false, this->vi[0] != this->vi[1])) &&
      ((local_21 = false, this->vi[1] != this->vi[2] &&
       (local_21 = false, this->vi[2] != this->vi[0])))))) {
    local_22 = true;
    if (this->vi[2] != this->vi[3]) {
      local_23 = false;
      if (this->vi[0] != this->vi[3]) {
        local_23 = this->vi[1] != this->vi[3];
      }
      local_22 = local_23;
    }
    local_21 = local_22;
  }
  return local_21;
}

Assistant:

bool
ON_MeshFace::IsValid(unsigned int mesh_vertex_count) const
{
  const unsigned int* uvi = (const unsigned int*)vi;
  return (uvi[0] < mesh_vertex_count
    && uvi[1] < mesh_vertex_count
    && uvi[2] < mesh_vertex_count
    && uvi[3] < mesh_vertex_count
    && uvi[0] != uvi[1] && uvi[1] != uvi[2] && uvi[2] != uvi[0]
    && (uvi[2] == uvi[3] || (uvi[0] != uvi[3] && uvi[1] != uvi[3])));
}